

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_send_text_frame_no_handler(void)

{
  cio_websocket *websocket;
  cio_error cVar1;
  size_t frame_length;
  undefined1 local_50 [4];
  cio_error err;
  cio_write_buffer wb;
  cio_write_buffer wbh;
  char data [5];
  
  memset((void *)((long)&wbh.data + 0xb),0x61,5);
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
  cio_write_buffer_element_init((cio_write_buffer *)local_50,(void *)((long)&wbh.data + 0xb),5);
  cio_write_buffer_queue_tail((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)local_50)
  ;
  websocket = ws;
  frame_length = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb.data + 8));
  cVar1 = cio_websocket_write_message_first_chunk
                    (websocket,frame_length,(cio_write_buffer *)((long)&wb.data + 8),true,false,
                     (cio_websocket_write_handler_t)0x0,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,"Writing a text frame with no handler did not fail!",0xac6,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_send_text_frame_no_handler(void)
{
	char data[5];
	memset(data, 'a', sizeof(data));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, data, sizeof(data));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, false, NULL, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Writing a text frame with no handler did not fail!");
}